

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

float * stbi__loadf_main(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  int iVar1;
  float *pfVar2;
  uchar *__ptr;
  uint uVar3;
  float *pfVar4;
  float *pfVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uchar *puVar12;
  float *pfVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  
  uVar10 = (ulong)(uint)req_comp;
  iVar1 = stbi__hdr_test(s);
  if (iVar1 == 0) {
    __ptr = stbi__load_flip(s,x,y,comp,req_comp);
    if (__ptr == (uchar *)0x0) {
      stbi__g_failure_reason = "Image not of any known type, or corrupt";
    }
    else {
      if (req_comp == 0) {
        req_comp = *comp;
      }
      uVar6 = *y * *x;
      pfVar2 = (float *)malloc((long)(int)(req_comp * uVar6) << 2);
      if (pfVar2 != (float *)0x0) {
        uVar3 = (req_comp + (req_comp & 1U)) - 1;
        uVar14 = 0;
        uVar10 = (ulong)uVar3;
        if ((int)uVar3 < 1) {
          uVar10 = uVar14;
        }
        lVar9 = (long)req_comp;
        pfVar5 = pfVar2;
        puVar12 = __ptr;
        uVar8 = (ulong)uVar6;
        if ((int)uVar6 < 1) {
          uVar8 = uVar14;
        }
        for (; uVar14 != uVar8; uVar14 = uVar14 + 1) {
          for (uVar16 = 0; uVar10 != uVar16; uVar16 = uVar16 + 1) {
            fVar17 = powf((float)puVar12[uVar16] / 255.0,stbi__l2h_gamma);
            pfVar5[uVar16] = fVar17 * stbi__l2h_scale;
          }
          if ((int)uVar10 < req_comp) {
            lVar7 = uVar14 * lVar9 + uVar10;
            pfVar2[lVar7] = (float)__ptr[lVar7] / 255.0;
          }
          pfVar5 = pfVar5 + lVar9;
          puVar12 = puVar12 + lVar9;
        }
        free(__ptr);
        return pfVar2;
      }
      free(__ptr);
      stbi__g_failure_reason = "Out of memory";
    }
  }
  else {
    pfVar2 = stbi__hdr_load(s,x,y,comp,req_comp);
    if (pfVar2 != (float *)0x0) {
      if (stbi__vertically_flip_on_load == 0) {
        return pfVar2;
      }
      uVar6 = *x;
      if (req_comp == 0) {
        uVar10 = (ulong)(uint)*comp;
      }
      uVar3 = *y >> 1;
      uVar8 = 0;
      uVar14 = 0;
      if (0 < (int)uVar10) {
        uVar14 = uVar10;
      }
      lVar9 = (long)(int)uVar10;
      uVar10 = 0;
      if (0 < (int)uVar6) {
        uVar10 = (ulong)uVar6;
      }
      uVar16 = (ulong)uVar3;
      if ((int)uVar3 < 1) {
        uVar16 = uVar8;
      }
      iVar1 = (*y + -1) * uVar6;
      pfVar5 = pfVar2;
      for (; uVar8 != uVar16; uVar8 = uVar8 + 1) {
        pfVar4 = (float *)((long)iVar1 * lVar9 * 4 + (long)pfVar2);
        pfVar13 = pfVar5;
        for (uVar15 = 0; uVar15 != uVar10; uVar15 = uVar15 + 1) {
          for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
            fVar17 = pfVar13[uVar11];
            pfVar13[uVar11] = pfVar4[uVar11];
            pfVar4[uVar11] = fVar17;
          }
          pfVar4 = pfVar4 + lVar9;
          pfVar13 = pfVar13 + lVar9;
        }
        iVar1 = iVar1 - uVar6;
        pfVar5 = pfVar5 + lVar9 * (int)uVar6;
      }
      return pfVar2;
    }
  }
  return (float *)0x0;
}

Assistant:

static float *stbi__loadf_main(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *data;
   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr_data = stbi__hdr_load(s,x,y,comp,req_comp);
      if (hdr_data)
         stbi__float_postprocess(hdr_data,x,y,comp,req_comp);
      return hdr_data;
   }
   #endif
   data = stbi__load_flip(s, x, y, comp, req_comp);
   if (data)
      return stbi__ldr_to_hdr(data, *x, *y, req_comp ? req_comp : *comp);
   return stbi__errpf("unknown image type", "Image not of any known type, or corrupt");
}